

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O0

void util::anon_unknown_0::to_utf8
               (string *from,string *to,codepage_id codepage,bitset<256UL> *lead_bytes)

{
  bool bVar1;
  string *psVar2;
  string *psVar3;
  unsigned_long *puVar4;
  char *pcVar5;
  string *psVar6;
  long in_RCX;
  codepage_id in_EDX;
  string *in_RSI;
  ulong in_RDI;
  size_t end;
  size_t start;
  string buffer;
  string *in_stack_00000108;
  string *in_stack_00000110;
  codepage_id in_stack_00000124;
  string *in_stack_00000128;
  string *in_stack_00000130;
  string *in_stack_00000288;
  string *in_stack_00000290;
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff70;
  undefined1 *local_70;
  unsigned_long local_68 [3];
  string *local_50;
  string *local_48;
  string local_40 [48];
  string *local_10;
  ulong local_8;
  
  if (in_EDX == 0x4b0) {
    utf16le_to_wtf8(in_stack_00000290,in_stack_00000288);
  }
  else if (in_EDX == 0x4e4) {
    windows1252_to_utf8(in_stack_00000110,in_stack_00000108);
  }
  else if (in_EDX == 0x6faf) {
    windows1252_to_utf8(in_stack_00000110,in_stack_00000108);
  }
  else if (in_RCX == 0) {
    bVar1 = to_utf8_iconv(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,0);
    if (!bVar1) {
      to_utf8_fallback(in_stack_00000130,in_stack_00000128,in_stack_00000124);
    }
  }
  else {
    local_10 = in_RSI;
    local_8 = in_RDI;
    std::__cxx11::string::string(local_40);
    local_48 = (string *)0x0;
    while (psVar6 = local_48, psVar2 = (string *)std::__cxx11::string::length(), psVar6 < psVar2) {
      local_50 = local_48;
      while (psVar2 = local_50, psVar3 = (string *)std::__cxx11::string::length(), psVar2 < psVar3)
      {
        std::__cxx11::string::operator[](local_8);
        bVar1 = std::bitset<256UL>::test
                          ((bitset<256UL> *)in_stack_ffffffffffffff30,
                           (size_t)in_stack_ffffffffffffff28);
        if (bVar1) {
          local_68[0] = std::__cxx11::string::length();
          local_70 = &local_50->field_0x2;
          puVar4 = std::min<unsigned_long>(local_68,(unsigned_long *)&local_70);
          local_50 = (string *)*puVar4;
        }
        else {
          pcVar5 = (char *)std::__cxx11::string::operator[](local_8);
          if (*pcVar5 == '\\') break;
          local_50 = (string *)&local_50->field_0x1;
        }
      }
      std::__cxx11::string::substr((ulong)&stack0xffffffffffffff70,local_8);
      in_stack_ffffffffffffff30 = (string *)&stack0xffffffffffffff70;
      std::__cxx11::string::operator=(local_40,(string *)in_stack_ffffffffffffff30);
      std::__cxx11::string::~string((string *)in_stack_ffffffffffffff30);
      util::to_utf8(in_stack_ffffffffffffff70,in_EDX,(bitset<256UL> *)psVar6);
      std::__cxx11::string::append(local_10);
      in_stack_ffffffffffffff28 = local_50;
      psVar6 = (string *)std::__cxx11::string::length();
      if (in_stack_ffffffffffffff28 < psVar6) {
        std::__cxx11::string::push_back((char)local_10);
      }
      local_48 = (string *)&local_50->field_0x1;
    }
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void to_utf8(const std::string & from, std::string & to, codepage_id codepage,
             const std::bitset<256> * lead_bytes) {
	
	switch(codepage) {
		case cp_utf16le:     utf16le_to_wtf8(from, to); return;
		case cp_windows1252: windows1252_to_utf8(from, to); return;
		case cp_iso_8859_1:  windows1252_to_utf8(from, to); return;
		default: break;
	}
	
	if(lead_bytes) {
		std::string buffer;
		for(size_t start = 0; start < from.length();) {
			size_t end = start;
			while(end < from.length()) {
				if(lead_bytes->test(static_cast<unsigned char>(from[end]))) {
					end = std::min(from.length(), end + 2);
				} else if(from[end] != 0x5C) {
					end++;
				} else {
					break;
				}
			}
			buffer = from.substr(start, end - start);
			util::to_utf8(buffer, codepage, NULL);
			to.append(buffer);
			if(end < from.length()) {
				to.push_back('\\');
			}
			start = end + 1;
		}
		return;
	}
	
	#if INNOEXTRACT_HAVE_ICONV
	if(to_utf8_iconv(from, to, codepage)) {
		return;
	}
	#endif
	
	#if INNOEXTRACT_HAVE_WIN32_CONV
	if(to_utf8_win32(from, to, codepage)) {
		return;
	}
	#endif
	
	to_utf8_fallback(from, to, codepage);
	
}